

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int sqlite3ApiExit(sqlite3 *db,int rc)

{
  uint uVar1;
  
  if ((rc == 0) && (db->mallocFailed == '\0')) {
    return 0;
  }
  if ((rc == 0xc0a) || (db->mallocFailed != '\0')) {
    sqlite3OomClear(db);
    uVar1 = 7;
    sqlite3Error(db,7);
  }
  else {
    uVar1 = rc & db->errMask;
  }
  return uVar1;
}

Assistant:

SQLITE_PRIVATE int sqlite3ApiExit(sqlite3* db, int rc){
  /* If the db handle must hold the connection handle mutex here.
  ** Otherwise the read (and possible write) of db->mallocFailed
  ** is unsafe, as is the call to sqlite3Error().
  */
  assert( db!=0 );
  assert( sqlite3_mutex_held(db->mutex) );
  if( db->mallocFailed || rc ){
    return apiHandleError(db, rc);
  }
  return 0;
}